

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  TimeInMillis local_68;
  String local_60;
  void *local_50 [2];
  string local_40;
  
  bVar1 = UnitTestImpl::Passed(unit_test->impl_);
  local_68 = unit_test->impl_->elapsed_time_;
  StreamableToString<long_long>((internal *)local_50,&local_68);
  String::Format(&local_60,"event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,
                 local_50[0]);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,local_60.c_str_,local_60.c_str_ + local_60.length_);
  Send(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60.c_str_ != (char *)0x0) {
    operator_delete__(local_60.c_str_);
  }
  if (local_50[0] != (void *)0x0) {
    operator_delete__(local_50[0]);
  }
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    Send(String::Format("event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",
                        unit_test.Passed(),
                        StreamableToString(unit_test.elapsed_time()).c_str()));
  }